

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::ServiceDescriptorProto::_InternalParse
          (ServiceDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  uint uVar5;
  MethodDescriptorProto *msg;
  ServiceOptions *pSVar6;
  char cVar7;
  uint32 res;
  uint tag;
  byte *p;
  Arena *pAVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_bool> pVar10;
  
  this_00 = &this->name_;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar10._8_8_ = 0;
      pVar10.first = ptr;
    }
    else {
      pVar10._8_8_ = 1;
      pVar10.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar10 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar10.first;
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)(p + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar9.second = res;
        pVar9.first = (char *)(p + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr = pVar9.first;
    if (ptr == (char *)0x0) {
LAB_002ed334:
      cVar7 = '\x04';
    }
    else {
      tag = pVar9.second;
      uVar5 = (uint)(pVar9._8_8_ >> 3) & 0x1fffffff;
      cVar7 = (char)pVar9.second;
      if (uVar5 == 3) {
        if (cVar7 != '\x1a') goto LAB_002ed2e7;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->options_ == (ServiceOptions *)0x0) {
          pAVar8 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
          }
          pSVar6 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(pAVar8);
          this->options_ = pSVar6;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::ServiceOptions>
                        (ctx,this->options_,ptr);
      }
      else {
        if (uVar5 == 2) {
          if (cVar7 == '\x12') {
            ptr = ptr + -1;
            do {
              pRVar4 = (this->method_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_002ed21d:
                internal::RepeatedPtrFieldBase::Reserve
                          (&(this->method_).super_RepeatedPtrFieldBase,
                           (this->method_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002ed22b:
                pRVar4 = (this->method_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                msg = Arena::CreateMaybeMessage<google::protobuf::MethodDescriptorProto>
                                ((this->method_).super_RepeatedPtrFieldBase.arena_);
                pRVar4 = (this->method_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
                (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[iVar3] = msg;
              }
              else {
                iVar3 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->method_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002ed21d;
                  goto LAB_002ed22b;
                }
                (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                msg = (MethodDescriptorProto *)pRVar4->elements[iVar3];
              }
              ptr = internal::ParseContext::ParseMessage<google::protobuf::MethodDescriptorProto>
                              (ctx,msg,ptr + 1);
              if (ptr == (char *)0x0) goto LAB_002ed334;
              cVar7 = '\x02';
            } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\x12'));
            goto LAB_002ed329;
          }
        }
        else if ((uVar5 == 1) && (cVar7 == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pAVar8 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
          }
          if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_00,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
          goto LAB_002ed317;
        }
LAB_002ed2e7:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar7 = '\t';
          goto LAB_002ed329;
        }
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
LAB_002ed317:
      cVar7 = (ptr == (char *)0x0) * '\x02' + '\x02';
    }
LAB_002ed329:
    if (cVar7 != '\x02') {
      if (cVar7 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* ServiceDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.ServiceDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_method(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ServiceOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}